

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pExpr,Fts5Colset *pColset)

{
  char *pcVar1;
  Fts5Colset *pFree;
  Fts5Colset *local_20;
  
  local_20 = pColset;
  if (pParse->pConfig->eDetail == 1) {
    pParse->rc = 1;
    pcVar1 = sqlite3_mprintf("fts5: column queries are not supported (detail=none)");
    pParse->zErr = pcVar1;
  }
  else {
    fts5ParseSetColset(pParse,pExpr,pColset,&local_20);
    pColset = local_20;
  }
  sqlite3_free(pColset);
  return;
}

Assistant:

static void sqlite3Fts5ParseSetColset(
  Fts5Parse *pParse, 
  Fts5ExprNode *pExpr, 
  Fts5Colset *pColset 
){
  Fts5Colset *pFree = pColset;
  if( pParse->pConfig->eDetail==FTS5_DETAIL_NONE ){
    pParse->rc = SQLITE_ERROR;
    pParse->zErr = sqlite3_mprintf(
      "fts5: column queries are not supported (detail=none)"
    );
  }else{
    fts5ParseSetColset(pParse, pExpr, pColset, &pFree);
  }
  sqlite3_free(pFree);
}